

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> * __thiscall
despot::BaseRockSample::ComputeOptimalSamplingPolicy(BaseRockSample *this)

{
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *pvVar1;
  pointer pVVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  clock_t cVar7;
  long lVar8;
  ulong uVar9;
  size_type __n;
  size_type sVar10;
  int a;
  ulong uVar11;
  double dVar12;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> next_policy;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  transition;
  allocator_type local_8d;
  uint local_8c;
  double local_88;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> local_80;
  ulong local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  clock_t local_48;
  long local_40;
  ulong local_38;
  
  uVar4 = (**(code **)(*(long *)this + 0x10))();
  pvVar1 = &this->mdp_policy_;
  __n = (size_type)(int)uVar4;
  if ((long)(this->mdp_policy_).
            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->mdp_policy_).
            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 != __n) {
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
              (&local_80,__n,(allocator_type *)&local_60);
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::_M_move_assign
              (pvVar1,&local_80);
    if (local_80.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.
                      super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (0 < (int)uVar4) {
      pVVar2 = (pvVar1->
               super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        *(undefined8 *)(pVVar2 + lVar8 + 8) = 0;
        lVar8 = lVar8 + 0x10;
      } while (__n << 4 != lVar8);
    }
    local_48 = clock();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Computing optimal MDP policy...",0x1f);
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
              (&local_80,__n,(allocator_type *)&local_60);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_60,__n,&local_8d);
    local_8c = uVar4;
    if (0 < (int)uVar4) {
      sVar10 = 0;
      do {
        std::vector<int,_std::allocator<int>_>::resize
                  (local_60.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + sVar10,5);
        lVar8 = 0;
        do {
          iVar5 = NextState(this,(int)sVar10,(ACT_TYPE)lVar8);
          local_60.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar10].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar8] = iVar5;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 5);
        sVar10 = sVar10 + 1;
      } while (sVar10 != __n);
    }
    local_88 = (double)Globals::NEG_INFTY;
    local_38 = (ulong)local_8c;
    local_40 = local_38 << 4;
    uVar9 = 0;
    do {
      local_68 = uVar9;
      if (0 < (int)local_8c) {
        uVar9 = 0;
        do {
          lVar8 = uVar9 * 0x10;
          *(undefined4 *)
           (local_80.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar8) = 0xffffffff;
          *(double *)
           (local_80.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar8 + 8) = local_88;
          uVar11 = 0;
          do {
            dVar12 = (double)(**(code **)(*(long *)this + 0x28))
                                       (this,uVar9 & 0xffffffff,uVar11 & 0xffffffff);
            dVar12 = _ParticleBelief *
                     *(double *)
                      ((pvVar1->
                       super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                      (long)local_60.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar9].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar11] * 0x10 + 8) + dVar12;
            if (*(double *)
                 (local_80.
                  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar8 + 8) <= dVar12 &&
                dVar12 != *(double *)
                           (local_80.
                            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar8 + 8)) {
              *(double *)
               (local_80.
                super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar8 + 8) = dVar12;
              *(int *)(local_80.
                       super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar8) = (int)uVar11;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != 5);
          uVar9 = uVar9 + 1;
        } while (uVar9 != local_38);
      }
      dVar12 = 0.0;
      if (0 < (int)local_8c) {
        lVar8 = 0;
        do {
          pVVar2 = (pvVar1->
                   super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          dVar12 = dVar12 + ABS(*(double *)
                                 (local_80.
                                  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar8 + 8) -
                                *(double *)(pVVar2 + lVar8 + 8));
          uVar3 = *(undefined8 *)
                   (local_80.
                    super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar8 + 8);
          pVVar2 = pVVar2 + lVar8;
          *(undefined8 *)pVVar2 =
               *(undefined8 *)
                (local_80.
                 super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar8);
          *(undefined8 *)(pVVar2 + 8) = uVar3;
          lVar8 = lVar8 + 0x10;
        } while (local_40 != lVar8);
      }
      uVar4 = (int)local_68 + 1;
      uVar9 = (ulong)uVar4;
    } while (0.001 <= dVar12);
    local_88 = dVar12;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Done [",6);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,uVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," iters, tol = ",0xe);
    poVar6 = std::ostream::_M_insert<double>(local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    cVar7 = clock();
    poVar6 = std::ostream::_M_insert<double>((double)(cVar7 - local_48) / 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"s]!",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_60);
    if (local_80.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.
                      super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return pvVar1;
}

Assistant:

vector<ValuedAction>& BaseRockSample::ComputeOptimalSamplingPolicy() const {
	int num_states = NumStates();
	if (mdp_policy_.size() == num_states)
		return mdp_policy_;

	mdp_policy_ = vector<ValuedAction>(num_states);
	for (int s = 0; s < num_states; s++) {
		mdp_policy_[s].value = 0;
	}

	clock_t start = clock();
	cerr << "Computing optimal MDP policy...";
	vector<ValuedAction> next_policy = vector<ValuedAction>(num_states);
	// Using precomputed transition saves around 60% of the time
	vector<vector<int> > transition = vector<vector<int> >(num_states);
	for (int s = 0; s < num_states; s++) {
		transition[s].resize(E_SAMPLE + 1);
		for (int a = 0; a <= E_SAMPLE; a++) // Sensing actions not needed
			transition[s][a] = NextState(s, a);
	}

	int iter = 0;
	double diff;
	while (true) {
		for (int s = 0; s < num_states; s++) {
			next_policy[s].action = -1;
			next_policy[s].value = Globals::NEG_INFTY;

			for (ACT_TYPE a = 0; a <= E_SAMPLE; a++) {
				double v = Reward(s, a)
					+ Globals::Discount() * mdp_policy_[transition[s][a]].value;

				if (v > next_policy[s].value) {
					next_policy[s].value = v;
					next_policy[s].action = a;
				}
			}
		}

		diff = 0;
		for (int s = 0; s < num_states; s++) {
			diff += fabs(next_policy[s].value - mdp_policy_[s].value);
			mdp_policy_[s] = next_policy[s];
		}

		iter++;
		if (diff < 0.001)
			break;
	}
	cerr << "Done [" << iter << " iters, tol = " << diff << ", "
		<< (double) (clock() - start) / CLOCKS_PER_SEC << "s]!" << endl;

	return mdp_policy_;
}